

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1>(cni_helper<cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *__args_1;
  void *in_RAX;
  any local_28;
  
  __args_1 = *(deque<cs_impl::any,_std::allocator<cs_impl::any>_> **)param_2;
  local_28.mDat = (proxy *)in_RAX;
  try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_1UL>
  ::convert((var *)&(__args_1->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                    _M_impl.super__Deque_impl_data._M_map_size);
  std::
  function<cs_impl::any_(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::operator()((function<cs_impl::any_(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)&local_28,(any *)args,__args_1);
  *(proxy **)this = local_28.mDat;
  local_28.mDat = (proxy *)0x0;
  any::recycle(&local_28);
  return (any)(proxy *)this;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}